

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseParams
          (StructTranslator *this,Reader params,MemberInfo *parent,StructOrGroup *layout)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  MemberInfo **ppMVar2;
  MemberInfo **ppMVar3;
  MemberInfo *pMVar4;
  ulong uVar5;
  size_t newSize;
  Reader param;
  ElementCount local_9c;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_98;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_90;
  Arena *local_88;
  ulong local_80;
  StructOrGroup *local_78;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_70;
  StructReader local_60;
  
  local_80 = (ulong)params.reader.elementCount;
  if (local_80 != 0) {
    local_88 = &this->arena;
    local_98 = &this->allMembers;
    local_90 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)&this->membersByOrdinal;
    uVar5 = 0;
    local_78 = layout;
    do {
      local_9c = (ElementCount)uVar5;
      capnp::_::ListReader::getStructElement(&local_60,&params.reader,local_9c);
      parent->childCount = parent->childCount + 1;
      local_70.first = local_70.first & 0xffffff00;
      pMVar4 = kj::Arena::
               allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int&,capnp::compiler::Declaration::Param::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                         (local_88,parent,&local_9c,(Reader *)&local_60,local_78,(bool *)&local_70);
      ppMVar2 = (this->allMembers).builder.endPtr;
      if ((this->allMembers).builder.pos == ppMVar2) {
        ppMVar3 = (local_98->builder).ptr;
        newSize = (long)ppMVar2 - (long)ppMVar3 >> 2;
        if (ppMVar2 == ppMVar3) {
          newSize = 4;
        }
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                  (local_98,newSize);
      }
      *(this->allMembers).builder.pos = pMVar4;
      pppMVar1 = &(this->allMembers).builder.pos;
      *pppMVar1 = *pppMVar1 + 1;
      local_70.first = local_9c;
      local_70.second = pMVar4;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
      ::
      _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                (local_90,&local_70);
      uVar5 = uVar5 + 1;
    } while (local_80 != uVar5);
  }
  return;
}

Assistant:

void traverseParams(List<Declaration::Param>::Reader params, MemberInfo& parent,
                      StructLayout::StructOrGroup& layout) {
    for (uint i: kj::indices(params)) {
      auto param = params[i];
      parent.childCount++;
      MemberInfo* memberInfo = &arena.allocate<MemberInfo>(parent, i, param, layout, false);
      allMembers.add(memberInfo);
      membersByOrdinal.insert(std::make_pair(i, memberInfo));
    }
  }